

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O2

path * __thiscall
ArgsManager::GetDataDir(path *__return_storage_ptr__,ArgsManager *this,bool net_specific)

{
  bool bVar1;
  CBaseChainParams *pCVar2;
  undefined7 in_register_00000011;
  path *this_00;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock8;
  path datadir;
  string in_stack_ffffffffffffff38;
  path local_a8;
  undefined1 local_78 [40];
  long local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&stack0xffffffffffffff48,
             &this->cs_args,"cs_args",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/common/args.cpp"
             ,0x135,false);
  this_00 = &(this->m_cached_datadir_path).super_path;
  if ((int)CONCAT71(in_register_00000011,net_specific) != 0) {
    this_00 = &(this->m_cached_network_datadir_path).super_path;
  }
  if ((this_00->_M_pathname)._M_string_length != 0) {
    std::filesystem::__cxx11::path::path(&__return_storage_ptr__->super_path,this_00);
    goto LAB_0012c041;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,"-datadir",(allocator<char> *)&stack0xffffffffffffff47);
  local_a8._M_pathname.field_2._M_allocated_capacity = 0;
  local_a8._M_pathname.field_2._8_8_ = 0;
  local_a8._M_pathname._M_dataplus._M_p = (pointer)0x0;
  local_a8._M_pathname._M_string_length = 0;
  local_a8._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  std::filesystem::__cxx11::path::path(&local_a8);
  GetPathArg((path *)(local_78 + 0x20),this,in_stack_ffffffffffffff38,(path *)local_78);
  std::filesystem::__cxx11::path::~path(&local_a8);
  std::__cxx11::string::~string((string *)local_78);
  if (local_50 == 0) {
    GetDefaultDataDir();
    std::filesystem::__cxx11::path::operator=(this_00,&local_a8);
    std::filesystem::__cxx11::path::~path(&local_a8);
LAB_0012bfee:
    if (net_specific) {
      pCVar2 = BaseParams();
      if ((pCVar2->strDataDir)._M_string_length != 0) {
        pCVar2 = BaseParams();
        fs::PathFromString((path *)&local_a8,&pCVar2->strDataDir);
        std::filesystem::__cxx11::path::operator/=(this_00,&local_a8);
        std::filesystem::__cxx11::path::~path(&local_a8);
      }
    }
  }
  else {
    fs::absolute((path *)&local_a8,(path *)(local_78 + 0x20));
    std::filesystem::__cxx11::path::operator=(this_00,&local_a8);
    std::filesystem::__cxx11::path::~path(&local_a8);
    bVar1 = std::filesystem::is_directory(this_00);
    if (bVar1) goto LAB_0012bfee;
    fs::path::operator=((path *)this_00,"");
  }
  std::filesystem::__cxx11::path::path(&__return_storage_ptr__->super_path,this_00);
  std::filesystem::__cxx11::path::~path((path *)(local_78 + 0x20));
LAB_0012c041:
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&stack0xffffffffffffff48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

fs::path ArgsManager::GetDataDir(bool net_specific) const
{
    LOCK(cs_args);
    fs::path& path = net_specific ? m_cached_network_datadir_path : m_cached_datadir_path;

    // Used cached path if available
    if (!path.empty()) return path;

    const fs::path datadir{GetPathArg("-datadir")};
    if (!datadir.empty()) {
        path = fs::absolute(datadir);
        if (!fs::is_directory(path)) {
            path = "";
            return path;
        }
    } else {
        path = GetDefaultDataDir();
    }

    if (net_specific && !BaseParams().DataDir().empty()) {
        path /= fs::PathFromString(BaseParams().DataDir());
    }

    return path;
}